

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

TabularCPT * __thiscall
despot::Parser::CreateTabularObsFunction(Parser *this,TiXmlElement *e_CondProb)

{
  NamedVar *child_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  TiXmlNode *pTVar4;
  mapped_type *ppVVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  TabularCPT *pTVar9;
  TiXmlElement *pTVar10;
  size_type t;
  char *__nptr;
  reference pvVar11;
  double dVar12;
  bool local_42a;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c5;
  int local_3c4;
  undefined1 local_3c0 [3];
  bool success;
  int i_2;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  int local_2b4;
  int i_1;
  int num;
  int num_entries;
  string table;
  vector<double,_std::allocator<double>_> values;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  TiXmlElement *e_Entry;
  TiXmlElement *e_Parameter;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1f8;
  TabularCPT *local_1e0;
  TabularCPT *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  byte local_189;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  string parent_name;
  int i;
  string local_100;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  NamedVar *child;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_58;
  undefined1 local_38 [8];
  string name;
  TiXmlElement *e_CondProb_local;
  Parser *this_local;
  
  name.field_2._8_8_ = e_CondProb;
  GetFirstChildText_abi_cxx11_((string *)local_38,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_58,(string *)local_38);
  bVar1 = Variable::IsVariableName(&local_58,&this->obs_vars_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 "In <ObsFunction>: Variable ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 " has not been declared as an ObsVar vname within the <Variable> tag.");
  pTVar4 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Var");
  Ensure(this,bVar1,&local_88,&pTVar4->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&child);
  std::__cxx11::string::~string((string *)&local_58);
  ppVVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,(key_type *)local_38);
  child_00 = (NamedVar *)*ppVVar5;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GetFirstChildText_abi_cxx11_(&local_100,this,(TiXmlElement *)name.field_2._8_8_,"Parent");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i," ",(allocator<char> *)(parent_name.field_2._M_local_buf + 0xf));
  Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e0,&local_100,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)(parent_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_100);
  for (parent_name.field_2._8_4_ = 0; uVar6 = (ulong)(int)parent_name.field_2._8_4_,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0), uVar6 < sVar7;
      parent_name.field_2._8_4_ = parent_name.field_2._8_4_ + 1) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_e0,(long)(int)parent_name.field_2._8_4_);
    std::__cxx11::string::string((string *)local_148,(string *)pvVar8);
    local_189 = 0;
    std::__cxx11::string::string((string *)&local_168,(string *)local_148);
    bVar1 = Variable::IsVariableName(&local_168,&this->curr_state_vars_);
    local_42a = true;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_188,(string *)local_148);
      local_189 = 1;
      local_42a = Variable::IsVariableName(&local_188,&this->action_vars_);
    }
    std::operator+(&local_1d0,"In <ObsFunction>: Parent ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
    std::operator+(&local_1b0,&local_1d0,
                   " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar4 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Parent");
    Ensure(this,local_42a,&local_1b0,&pTVar4->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    if ((local_189 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_188);
    }
    std::__cxx11::string::~string((string *)&local_168);
    ppVVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,(key_type *)local_148);
    func = (TabularCPT *)*ppVVar5;
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::push_back
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
               &parent_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&func);
    std::__cxx11::string::~string((string *)local_148);
  }
  pTVar9 = (TabularCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_1f8,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TabularCPT::TabularCPT(pTVar9,child_00,&local_1f8);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector(&local_1f8);
  local_1e0 = pTVar9;
  pTVar10 = GetParameterElement(this,(TiXmlElement *)name.field_2._8_8_);
  instance.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Entry");
  while (pTVar9 = local_1e0,
        instance.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    GetFirstChildText_abi_cxx11_
              (&local_248,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268," ",
               (allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_228,&local_248,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_248);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    GetFirstChildText_abi_cxx11_
              ((string *)&num,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ProbTable");
    iVar2 = ComputeNumOfEntries(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_228,
                                (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                                &parent_names.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,child_00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &num,"uniform");
    if (bVar1) {
      iVar3 = Variable::Size((Variable *)child_00);
      for (local_2b4 = 0; local_2b4 < iVar2; local_2b4 = local_2b4 + 1) {
        value_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(1.0 / (double)iVar3);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),
                   (value_type_conflict3 *)
                   &value_tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8," ",&local_2f9);
      Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2d8,(string *)&num,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
      to_string<int>(&local_3a0,iVar2);
      std::operator+(&local_380,"In <ObsFunction>: ",&local_3a0);
      std::operator+(&local_360,&local_380," entries expected but ");
      t = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d8);
      to_string<unsigned_long>((string *)local_3c0,t);
      std::operator+(&local_340,&local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
      ;
      std::operator+(&local_320,&local_340," found.");
      pTVar10 = GetFirstChildElement
                          (this,(TiXmlElement *)
                                instance.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,"ProbTable");
      Ensure(this,(long)iVar2 == sVar7,&local_320,(TiXmlBase *)pTVar10);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),sVar7);
      for (local_3c4 = 0; uVar6 = (ulong)local_3c4,
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2d8), uVar6 < sVar7; local_3c4 = local_3c4 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8,(long)local_3c4);
        __nptr = (char *)std::__cxx11::string::c_str();
        dVar12 = atof(__nptr);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),
                             (long)local_3c4);
        *pvVar11 = dVar12;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
    }
    iVar2 = (*(local_1e0->super_CPT).super_Function._vptr_Function[2])
                      (local_1e0,local_228,(undefined1 *)((long)&table.field_2 + 8));
    bVar1 = (bool)((byte)iVar2 & 1);
    local_3c5 = bVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"In <ObsFunction>: Value assignment failed.",&local_3e9);
    pTVar10 = GetFirstChildElement
                        (this,(TiXmlElement *)
                              instance.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    Ensure(this,bVar1,&local_3e8,(TiXmlBase *)pTVar10);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    instance.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)util::tinyxml::TiXmlNode::NextSiblingElement
                            ((TiXmlNode *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&num);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_38);
  return pTVar9;
}

Assistant:

TabularCPT* Parser::CreateTabularObsFunction(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, obs_vars_),
		"In <ObsFunction>: Variable " + name
			+ " has not been declared as an ObsVar vname within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <ObsFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <ObsFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success, "In <ObsFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}